

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwarf.c
# Opt level: O0

int report_inlined_functions
              (uintptr_t pc,function *function,backtrace_full_callback callback,void *data,
              char **filename,int *lineno)

{
  function *function_00;
  int ret;
  function *inlined;
  function_addrs *match;
  function_addrs *p;
  int *lineno_local;
  char **filename_local;
  void *data_local;
  backtrace_full_callback callback_local;
  function *function_local;
  uintptr_t pc_local;
  
  if (function->function_addrs_count == 0) {
    pc_local._4_4_ = 0;
  }
  else if (pc == 0xffffffffffffffff) {
    pc_local._4_4_ = 0;
  }
  else {
    function_local = (function *)pc;
    match = (function_addrs *)
            bsearch(&function_local,function->function_addrs,function->function_addrs_count,0x18,
                    function_addrs_search);
    if (match == (function_addrs *)0x0) {
      pc_local._4_4_ = 0;
    }
    else {
      for (; function_local == (function *)match[1].low; match = match + 1) {
      }
      inlined = (function *)0x0;
      for (; (function *)match->high <= function_local; match = match + -1) {
        if ((match == function->function_addrs) || (match[-1].low < match->low)) goto LAB_00156e3c;
      }
      inlined = (function *)match;
LAB_00156e3c:
      if (inlined == (function *)0x0) {
        pc_local._4_4_ = 0;
      }
      else {
        function_00 = *(function **)&inlined->caller_lineno;
        pc_local._4_4_ =
             report_inlined_functions
                       ((uintptr_t)function_local,function_00,callback,data,filename,lineno);
        if ((pc_local._4_4_ == 0) &&
           (pc_local._4_4_ =
                 (*callback)(data,(uintptr_t)function_local,*filename,*lineno,function_00->name),
           pc_local._4_4_ == 0)) {
          *filename = function_00->caller_filename;
          *lineno = function_00->caller_lineno;
          pc_local._4_4_ = 0;
        }
      }
    }
  }
  return pc_local._4_4_;
}

Assistant:

static int
report_inlined_functions (uintptr_t pc, struct function *function,
			  backtrace_full_callback callback, void *data,
			  const char **filename, int *lineno)
{
  struct function_addrs *p;
  struct function_addrs *match;
  struct function *inlined;
  int ret;

  if (function->function_addrs_count == 0)
    return 0;

  /* Our search isn't safe if pc == -1, as that is the sentinel
     value.  */
  if (pc + 1 == 0)
    return 0;

  p = ((struct function_addrs *)
       bsearch (&pc, function->function_addrs,
		function->function_addrs_count,
		sizeof (struct function_addrs),
		function_addrs_search));
  if (p == NULL)
    return 0;

  /* Here pc >= p->low && pc < (p + 1)->low.  The function_addrs are
     sorted by low, so if pc > p->low we are at the end of a range of
     function_addrs with the same low value.  If pc == p->low walk
     forward to the end of the range with that low value.  Then walk
     backward and use the first range that includes pc.  */
  while (pc == (p + 1)->low)
    ++p;
  match = NULL;
  while (1)
    {
      if (pc < p->high)
	{
	  match = p;
	  break;
	}
      if (p == function->function_addrs)
	break;
      if ((p - 1)->low < p->low)
	break;
      --p;
    }
  if (match == NULL)
    return 0;

  /* We found an inlined call.  */

  inlined = match->function;

  /* Report any calls inlined into this one.  */
  ret = report_inlined_functions (pc, inlined, callback, data,
				  filename, lineno);
  if (ret != 0)
    return ret;

  /* Report this inlined call.  */
  ret = callback (data, pc, *filename, *lineno, inlined->name);
  if (ret != 0)
    return ret;

  /* Our caller will report the caller of the inlined function; tell
     it the appropriate filename and line number.  */
  *filename = inlined->caller_filename;
  *lineno = inlined->caller_lineno;

  return 0;
}